

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O3

int intGpioSetAlertFunc(uint gpio,void *f,int user,void *userdata)

{
  ulong uVar1;
  FILE *__stream;
  uint uVar2;
  
  __stream = _stderr;
  uVar1 = (ulong)gpio;
  if ((4 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(__stream,"%s %s: gpio=%d function=%08X, user=%d, userdata=%08X\n",myTimeStamp::buf,
            "intGpioSetAlertFunc",uVar1,(ulong)f & 0xffffffff,(ulong)(uint)user,userdata);
  }
  gpioAlert[uVar1].ex = user;
  gpioAlert[uVar1].userdata = userdata;
  gpioAlert[uVar1].func = (callbk_t)f;
  uVar2 = 1 << ((byte)gpio & 0x1f);
  if (f == (void *)0x0) {
    alertBits = ~uVar2 & alertBits;
  }
  else {
    alertBits = uVar2 | alertBits;
  }
  monitorBits = alertBits | notifyBits | scriptBits | gpioGetSamples_3;
  return monitorBits;
}

Assistant:

static int intGpioSetAlertFunc(
   unsigned gpio,
   void *   f,
   int      user,
   void *   userdata)
{
   DBG(DBG_INTERNAL, "gpio=%d function=%08X, user=%d, userdata=%08X",
      gpio, (uint32_t)f, user, (uint32_t)userdata);

   gpioAlert[gpio].ex = user;
   gpioAlert[gpio].userdata = userdata;

   gpioAlert[gpio].func = f;

   if (f)
   {
      alertBits |= BIT;
   }
   else
   {
      alertBits &= ~BIT;
   }

   monitorBits = alertBits | notifyBits | scriptBits | gpioGetSamples.bits;

   return 0;
}